

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter(ForkedPromiseAwaiter<void> *this)

{
  ForkedPromiseAwaiter<void> *this_local;
  
  PromiseAwaiter<void>::~PromiseAwaiter(&this->awaiter);
  ForkBranch<kj::_::Void,_false>::~ForkBranch(&this->node);
  return;
}

Assistant:

ForkedPromiseAwaiter(ForkedPromise<T>& promise)
      : node(promise), awaiter(OwnPromiseNode(&node)) { }